

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaVarIterator.hpp
# Opt level: O0

bool Kernel::isFreeVariableOf<Kernel::Literal*>(Literal *thing,uint var)

{
  bool bVar1;
  uint uVar2;
  uint in_ESI;
  FormulaVarIterator fvi;
  undefined4 in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  Term *in_stack_ffffffffffffff38;
  FormulaVarIterator *in_stack_ffffffffffffff40;
  bool local_1;
  
  FormulaVarIterator::FormulaVarIterator(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  do {
    bVar1 = FormulaVarIterator::hasNext((FormulaVarIterator *)fvi._instructions._end);
    if (!bVar1) {
      local_1 = false;
      goto LAB_00b8ad87;
    }
    in_stack_fffffffffffffef4 = in_ESI;
    uVar2 = FormulaVarIterator::next((FormulaVarIterator *)&stack0xffffffffffffff10);
  } while (in_stack_fffffffffffffef4 != uVar2);
  local_1 = true;
LAB_00b8ad87:
  FormulaVarIterator::~FormulaVarIterator
            ((FormulaVarIterator *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  return local_1;
}

Assistant:

bool isFreeVariableOf(T thing, unsigned var)
{
  FormulaVarIterator fvi(thing);
  while (fvi.hasNext()) {
    if (var == fvi.next()) {
      return true;
    }
  }
  return false;
}